

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

BinOpr expr_binop(LexState *ls,ExpDesc *v,uint32_t limit)

{
  BCPos BVar1;
  ExpKind EVar2;
  FuncState *pFVar3;
  anon_union_8_3_2ce71dea_for_u aVar4;
  bool bVar5;
  uint uVar6;
  BinOpr BVar7;
  BCReg BVar8;
  BCReg BVar9;
  BCReg BVar10;
  undefined4 uVar11;
  int iVar12;
  BCPos BVar13;
  TValue TVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined4 extraout_var;
  anon_union_8_3_2ce71dea_for_u *e;
  uint32_t uVar17;
  BCPos *l1;
  BCIns BVar18;
  BinOpr BVar19;
  anon_union_8_3_2ce71dea_for_u *v_00;
  TValue *o;
  GCstr *pGVar20;
  ExpDesc v2;
  anon_union_8_3_2ce71dea_for_u local_68;
  int iStack_60;
  BCPos BStack_5c;
  BCPos local_58;
  undefined4 uStack_54;
  anon_union_8_3_2ce71dea_for_u *local_50;
  BinOpr local_48;
  uint32_t local_44;
  undefined8 local_40;
  BCPos *local_38;
  
  uVar6 = ls->level + 1;
  ls->level = uVar6;
  local_44 = limit;
  if (199 < uVar6) {
    lj_lex_error(ls,0,LJ_ERR_XLEVELS);
  }
  iVar12 = ls->token;
  if (iVar12 < 0x114) {
    if (0x106 < iVar12) {
      switch(iVar12) {
      case 0x107:
        uVar15 = 0xffffffff00000001;
        break;
      default:
        goto switchD_0011a91c_caseD_108;
      case 0x109:
        lj_lex_next(ls);
        parse_body(ls,v,0,ls->linenumber);
        goto LAB_0011abfe;
      case 0x10e:
        uVar15 = 0xffffffff00000000;
        break;
      case 0x10f:
        uVar6 = 0x11;
        goto LAB_0011aa9b;
      }
LAB_0011aa47:
      v->k = (int)uVar15;
      v->t = (int)((ulong)uVar15 >> 0x20);
      (v->u).s.info = 0;
      v->f = 0xffffffff;
      goto LAB_0011aa82;
    }
    if (iVar12 == 0x23) {
      uVar6 = 0x13;
    }
    else {
      if (iVar12 != 0x2d) {
        if (iVar12 != 0x7b) goto switchD_0011a91c_caseD_108;
        expr_table(ls,v);
        goto LAB_0011abfe;
      }
      uVar6 = 0x12;
    }
LAB_0011aa9b:
    lj_lex_next(ls);
    expr_binop(ls,v,8);
    pFVar3 = ls->fs;
    if (uVar6 == 0x12) {
      if (v->t == v->f) {
        if (v->k == VKLAST) {
          if (((ulong)(v->u).sval & 0x7fffffffffffffff) == 0) goto LAB_0011abc4;
          (v->u).sval = (GCstr *)((ulong)(v->u).sval ^ 0x8000000000000000);
        }
        else {
          if (v->k != VKCDATA) goto LAB_0011abc4;
          uVar16 = (ulong)(v->u).s.info;
          if (*(short *)(uVar16 + 6) == 0x10) {
            *(byte *)(uVar16 + 0x17) = *(byte *)(uVar16 + 0x17) ^ 0x80;
          }
          else {
            *(long *)(uVar16 + 8) = -*(long *)(uVar16 + 8);
          }
        }
        goto LAB_0011abfe;
      }
LAB_0011abc4:
      expr_toanyreg(pFVar3,v);
LAB_0011abcf:
      if ((v->k == VNONRELOC) && (pFVar3->nactvar <= (v->u).s.info)) {
        pFVar3->freereg = pFVar3->freereg - 1;
      }
      BVar13 = bcemit_INS(pFVar3,(v->u).s.info << 0x10 | uVar6);
      (v->u).s.info = BVar13;
      v->k = VRELOCABLE;
    }
    else {
      if (uVar6 != 0x11) goto LAB_0011abc4;
      BVar13 = v->t;
      BVar1 = v->f;
      v->f = BVar13;
      v->t = BVar1;
      jmp_dropval(pFVar3,BVar13);
      jmp_dropval(pFVar3,v->t);
      expr_discharge(pFVar3,v);
      EVar2 = v->k;
      if (VKFALSE < EVar2) {
        if (EVar2 < VLOCAL) {
          v->k = VKFALSE;
          goto LAB_0011abfe;
        }
        if (EVar2 == VJMP) {
          *(byte *)&pFVar3->bcbase[(v->u).s.info - 1].ins =
               (byte)pFVar3->bcbase[(v->u).s.info - 1].ins ^ 1;
          goto LAB_0011abfe;
        }
        if (EVar2 == VRELOCABLE) {
          bcreg_reserve(pFVar3,1);
          *(char *)((long)&pFVar3->bcbase[(v->u).s.info].ins + 1) = (char)pFVar3->freereg + -1;
          (v->u).s.info = pFVar3->freereg - 1;
          v->k = VNONRELOC;
        }
        goto LAB_0011abcf;
      }
      v->k = VKTRUE;
    }
  }
  else {
    if (iVar12 < 0x11e) {
      if (iVar12 == 0x114) {
        uVar15 = 0xffffffff00000002;
        goto LAB_0011aa47;
      }
      if (iVar12 != 0x118) {
switchD_0011a91c_caseD_108:
        expr_primary(ls,v);
        goto LAB_0011abfe;
      }
      pFVar3 = ls->fs;
      if ((pFVar3->flags & 2) == 0) {
        err_syntax(ls,LJ_ERR_XDOTS);
      }
      bcreg_reserve(pFVar3,1);
      uVar17 = pFVar3->freereg - 1;
      BVar13 = bcemit_INS(pFVar3,(uint)pFVar3->numparams << 0x10 | uVar17 * 0x100 | 0x2000043);
      v->k = VCALL;
      (v->u).s.info = BVar13;
      v->t = 0xffffffff;
      v->f = 0xffffffff;
      (v->u).s.aux = uVar17;
    }
    else {
      if (iVar12 == 0x11e) {
        v->k = (ls->tokenval).field_2.it == 0xfffffff5 | VKLAST;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        TVar14 = ls->tokenval;
      }
      else {
        if (iVar12 != 0x120) goto switchD_0011a91c_caseD_108;
        v->k = VKSTR;
        v->t = 0xffffffff;
        (v->u).s.info = 0;
        v->f = 0xffffffff;
        TVar14.field_2.it = 0;
        TVar14.field_2.field_0 =
             (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
             (ls->tokenval).u32.lo;
      }
      v->u = (anon_union_8_3_2ce71dea_for_u)TVar14;
    }
LAB_0011aa82:
    lj_lex_next(ls);
  }
LAB_0011abfe:
  iVar12 = ls->token;
  if (iVar12 < 0x5e) {
    switch(iVar12) {
    case 0x25:
      BVar19 = OPR_MOD;
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_0011ac1c_caseD_26:
      BVar19 = OPR_NOBINOPR;
      bVar5 = true;
      goto LAB_0011acd6;
    case 0x2a:
      BVar19 = OPR_MUL;
      break;
    case 0x2b:
      bVar5 = false;
      BVar19 = OPR_ADD;
      goto LAB_0011acd6;
    case 0x2d:
      BVar19 = OPR_SUB;
      break;
    case 0x2f:
      BVar19 = OPR_DIV;
      break;
    default:
      if (iVar12 == 0x3c) {
        BVar19 = OPR_LT;
      }
      else {
        if (iVar12 != 0x3e) goto switchD_0011ac1c_caseD_26;
        BVar19 = OPR_GT;
      }
    }
  }
  else {
    switch(iVar12) {
    case 0x110:
      BVar19 = OPR_OR;
      break;
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x116:
    case 0x118:
      goto switchD_0011ac1c_caseD_26;
    case 0x117:
      BVar19 = OPR_CONCAT;
      break;
    case 0x119:
      BVar19 = OPR_EQ;
      break;
    case 0x11a:
      BVar19 = OPR_GE;
      break;
    case 0x11b:
      BVar19 = OPR_LE;
      break;
    case 0x11c:
      BVar19 = OPR_NE;
      break;
    default:
      if (iVar12 == 0x5e) {
        BVar19 = OPR_POW;
      }
      else {
        if (iVar12 != 0x101) goto switchD_0011ac1c_caseD_26;
        BVar19 = OPR_AND;
      }
    }
  }
  bVar5 = false;
LAB_0011acd6:
  if (!bVar5) {
    local_38 = &v->t;
    do {
      if (priority[BVar19].left <= local_44) break;
      lj_lex_next(ls);
      pFVar3 = ls->fs;
      if (BVar19 == OPR_CONCAT) {
        expr_tonextreg(pFVar3,v);
      }
      else if (BVar19 == OPR_OR) {
        expr_discharge(pFVar3,v);
        EVar2 = v->k;
        if (EVar2 - VKTRUE < 3) {
          expr_toreg_nobranch(pFVar3,v,0xff);
          BVar13 = bcemit_jmp(pFVar3);
        }
        else {
          BVar13 = 0xffffffff;
          if (VKFALSE < EVar2) {
            if (EVar2 == VJMP) {
              BVar13 = (v->u).s.info;
            }
            else {
              BVar13 = bcemit_branch(pFVar3,v,1);
            }
          }
        }
        jmp_append(pFVar3,local_38,BVar13);
        BVar13 = v->f;
        pFVar3->lasttarget = pFVar3->pc;
        jmp_append(pFVar3,&pFVar3->jpc,BVar13);
        v->f = 0xffffffff;
      }
      else if (BVar19 == OPR_AND) {
        bcemit_branch_t(pFVar3,v);
      }
      else {
        if (BVar19 - OPR_NE < 2) {
          if (v->k < VKCDATA) {
LAB_0011ad94:
            if (v->t == v->f) goto LAB_0011ae07;
          }
        }
        else if (v->k == VKLAST) goto LAB_0011ad94;
        expr_toanyreg(pFVar3,v);
      }
LAB_0011ae07:
      v_00 = &local_68;
      BVar7 = expr_binop(ls,(ExpDesc *)&v_00->s,(uint)priority[BVar19].right);
      pFVar3 = ls->fs;
      if (BVar19 < OPR_CONCAT) {
        if ((((v->k != VKLAST) || (v->t != v->f)) || (iStack_60 != 4)) ||
           ((BStack_5c != local_58 ||
            (pGVar20 = (GCstr *)lj_vm_foldarith((v->u).sval,CONCAT44(local_68.s.aux,local_68.s.info)
                                                ,BVar19),
            0x7ff0000000000000 < ((ulong)pGVar20 & 0x7fffffffffffffff))))) {
          if (BVar19 == OPR_POW) {
            BVar8 = expr_toanyreg(pFVar3,(ExpDesc *)&v_00->s);
            BVar9 = expr_toanyreg(pFVar3,v);
            uVar6 = 0x23;
          }
          else {
            expr_toval(pFVar3,(ExpDesc *)&v_00->s);
            if ((iStack_60 == 4) && (BVar10 = const_num(pFVar3,(ExpDesc *)&v_00->s), BVar10 < 0x100)
               ) {
              uVar6 = BVar19 + 0x14;
            }
            else {
              uVar6 = BVar19 + 0x1e;
              BVar10 = expr_toanyreg(pFVar3,(ExpDesc *)&v_00->s);
            }
            expr_toval(pFVar3,v);
            if (((v->k == VKLAST) && (iStack_60 != 4)) &&
               (BVar8 = const_num(pFVar3,v), BVar8 < 0x100)) {
              uVar6 = uVar6 - 5;
              BVar9 = BVar10;
            }
            else {
              BVar9 = expr_toanyreg(pFVar3,v);
              BVar8 = BVar10;
            }
          }
          if ((v->k == VNONRELOC) && (pFVar3->nactvar <= (v->u).s.info)) {
            pFVar3->freereg = pFVar3->freereg - 1;
          }
          if ((iStack_60 == 0xc) && (pFVar3->nactvar <= local_68.s.info)) {
            pFVar3->freereg = pFVar3->freereg - 1;
          }
          BVar18 = BVar8 << 0x10 | BVar9 << 0x18 | uVar6;
LAB_0011afb0:
          uVar11 = bcemit_INS(pFVar3,BVar18);
          goto LAB_0011afb5;
        }
        (v->u).sval = pGVar20;
        BVar19 = BVar7;
      }
      else {
        if (BVar19 != OPR_CONCAT) {
          if (BVar19 == OPR_OR) {
            expr_discharge(pFVar3,(ExpDesc *)&v_00->s);
            BVar13 = v->t;
            l1 = &BStack_5c;
          }
          else {
            if (BVar19 != OPR_AND) {
              expr_toval(pFVar3,v);
              local_48 = BVar7;
              if (BVar19 - OPR_NE < 2) {
                uVar6 = BVar19 == OPR_EQ ^ 5;
                local_50 = &v->u;
                if (v->k < VKCDATA) {
                  local_50 = v_00;
                  v_00 = &v->u;
                }
                BVar10 = expr_toanyreg(pFVar3,(ExpDesc *)&local_50->s);
                local_40 = CONCAT44(extraout_var,BVar10);
                expr_toval(pFVar3,(ExpDesc *)&v_00->s);
                EVar2 = v_00[1].s.info;
                iVar12 = (int)local_40;
                if (EVar2 < VKSTR) {
                  BVar18 = EVar2 << 0x10 | iVar12 * 0x100 + uVar6 + 6;
                  e = local_50;
                }
                else if (EVar2 == VKSTR) {
                  BVar10 = const_gc(pFVar3,(GCobj *)((anon_union_8_3_2ce71dea_for_u *)
                                                    &(v_00->s).info)->sval,0xfffffffb);
                  BVar18 = (BVar10 << 0x10 | iVar12 << 8) + uVar6 + 2;
                  e = local_50;
                }
                else if (EVar2 == VKLAST) {
                  BVar10 = const_num(pFVar3,(ExpDesc *)&v_00->s);
                  BVar18 = BVar10 << 0x10 | uVar6 + iVar12 * 0x100 + 4;
                  e = local_50;
                }
                else {
                  BVar10 = expr_toanyreg(pFVar3,(ExpDesc *)&v_00->s);
                  BVar18 = BVar10 << 0x10 | iVar12 << 8 | uVar6;
                  e = local_50;
                }
              }
              else {
                uVar6 = BVar19 - OPR_LT;
                e = &v->u;
                if ((uVar6 & 1) != 0) {
                  uVar6 = uVar6 ^ 3;
                  expr_toval(pFVar3,(ExpDesc *)&v_00->s);
                  e = v_00;
                  v_00 = &v->u;
                }
                BVar10 = expr_toanyreg(pFVar3,(ExpDesc *)&v_00->s);
                BVar8 = expr_toanyreg(pFVar3,(ExpDesc *)&e->s);
                BVar18 = BVar10 << 0x10 | uVar6 | BVar8 << 8;
              }
              if ((e[1].s.info == VNONRELOC) &&
                 (pFVar3->nactvar <= (((anon_union_8_3_2ce71dea_for_u *)&(e->s).info)->s).info)) {
                pFVar3->freereg = pFVar3->freereg - 1;
              }
              if ((v_00[1].s.info == VNONRELOC) &&
                 (pFVar3->nactvar <= (((anon_union_8_3_2ce71dea_for_u *)&(v_00->s).info)->s).info))
              {
                pFVar3->freereg = pFVar3->freereg - 1;
              }
              bcemit_INS(pFVar3,BVar18);
              BVar13 = bcemit_jmp(pFVar3);
              (v->u).s.info = BVar13;
              v->k = VJMP;
              BVar19 = local_48;
              goto LAB_0011aff4;
            }
            expr_discharge(pFVar3,(ExpDesc *)&v_00->s);
            BVar13 = v->f;
            l1 = &local_58;
          }
          jmp_append(pFVar3,l1,BVar13);
          *(ulong *)&v->f = CONCAT44(uStack_54,local_58);
          aVar4.s.aux = local_68.s.aux;
          aVar4.s.info = local_68.s.info;
          v->u = aVar4;
          v->k = iStack_60;
          v->t = BStack_5c;
          BVar19 = BVar7;
          goto LAB_0011aff4;
        }
        expr_toval(pFVar3,(ExpDesc *)&v_00->s);
        if (iStack_60 != 0xb) {
LAB_0011b0d0:
          expr_tonextreg(pFVar3,(ExpDesc *)&v_00->s);
          if ((iStack_60 == 0xc) && (pFVar3->nactvar <= local_68.s.info)) {
            pFVar3->freereg = pFVar3->freereg - 1;
          }
          if ((v->k == VNONRELOC) && (pFVar3->nactvar <= (v->u).s.info)) {
            pFVar3->freereg = pFVar3->freereg - 1;
          }
          BVar18 = local_68.s.info << 0x10 | (v->u).s.info << 0x18 | 0x24;
          goto LAB_0011afb0;
        }
        if ((char)pFVar3->bcbase[local_68.s.info].ins != '$') goto LAB_0011b0d0;
        if ((v->k == VNONRELOC) && (pFVar3->nactvar <= (v->u).s.info)) {
          pFVar3->freereg = pFVar3->freereg - 1;
        }
        *(undefined1 *)((long)&pFVar3->bcbase[local_68.s.info].ins + 3) = *(undefined1 *)&v->u;
        uVar11 = local_68.s.info;
LAB_0011afb5:
        (v->u).s.info = uVar11;
        v->k = VRELOCABLE;
        BVar19 = BVar7;
      }
LAB_0011aff4:
    } while (BVar19 != OPR_NOBINOPR);
  }
  ls->level = ls->level - 1;
  return BVar19;
}

Assistant:

static BinOpr expr_binop(LexState *ls, ExpDesc *v, uint32_t limit)
{
  BinOpr op;
  synlevel_begin(ls);
  expr_unop(ls, v);
  op = token2binop(ls->token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    ExpDesc v2;
    BinOpr nextop;
    lj_lex_next(ls);
    bcemit_binop_left(ls->fs, op, v);
    /* Parse binary expression with higher priority. */
    nextop = expr_binop(ls, &v2, priority[op].right);
    bcemit_binop(ls->fs, op, v, &v2);
    op = nextop;
  }
  synlevel_end(ls);
  return op;  /* Return unconsumed binary operator (if any). */
}